

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<Non_Poly_Base_const>
          (Object_Data *this,shared_ptr<const_Non_Poly_Base> *obj,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined1 local_49;
  Any local_48;
  Any local_40 [3];
  element_type *local_28;
  element_type *ptr;
  shared_ptr<const_Non_Poly_Base> *psStack_18;
  bool t_return_value_local;
  shared_ptr<const_Non_Poly_Base> *obj_local;
  
  ptr._7_1_ = t_return_value;
  psStack_18 = obj;
  obj_local = (shared_ptr<const_Non_Poly_Base> *)this;
  local_28 = Catch::clara::std::__shared_ptr<const_Non_Poly_Base,_(__gnu_cxx::_Lock_policy)2>::get
                       (&obj->super___shared_ptr<const_Non_Poly_Base,_(__gnu_cxx::_Lock_policy)2>);
  detail::Get_Type_Info<const_Non_Poly_Base>::get();
  detail::Any::Any<std::shared_ptr<Non_Poly_Base_const>,void>(&local_48,psStack_18);
  local_49 = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,Non_Poly_Base_const*&,bool&>
            ((Type_Info *)this,local_40,(bool *)&local_48,(Non_Poly_Base **)&local_49,
             (bool *)&local_28);
  detail::Any::~Any(&local_48);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::shared_ptr<T> &&obj, bool t_return_value) {
        auto ptr = obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), false, ptr, t_return_value);
      }